

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

bool tinyusdz::tydra::IsPathIncluded
               (CollectionMembershipQuery *query,Stage *stage,Path *abs_path,
               ExpansionRule expansionRule)

{
  bool bVar1;
  
  if (((abs_path->_valid != true) || ((abs_path->_prim_part)._M_string_length != 1)) ||
     (bVar1 = true, *(abs_path->_prim_part)._M_dataplus._M_p != '/')) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool IsPathIncluded(const CollectionMembershipQuery &query, const Stage &stage,
                    const Path &abs_path,
                    const CollectionInstance::ExpansionRule expansionRule) {
  (void)query;
  (void)stage;
  (void)expansionRule;

  DCOUT("TODO");

  if (!abs_path.is_valid()) {
    return false;
  }

  if (abs_path.is_root_path()) {
    return true;
  }

  return false;
}